

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

int __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,int __fd,sockaddr *__addr,
          socklen_t __len)

{
  int extraout_EAX;
  service_type *this_00;
  implementation_type *piVar1;
  undefined4 in_register_00000034;
  error_code ec;
  char *in_stack_ffffffffffffffb8;
  undefined1 local_20 [16];
  sockaddr *local_10;
  basic_socket<asio::ip::udp,_asio::any_io_executor> *local_8;
  
  local_10 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  CLI::std::error_code::error_code((error_code *)this);
  this_00 = asio::detail::
            io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
            ::get_service(&this->impl_);
  piVar1 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_implementation(&this->impl_);
  asio::detail::reactive_socket_service<asio::ip::udp>::bind
            (this_00,(int)piVar1,local_10,(socklen_t)local_20);
  asio::detail::throw_error((error_code *)this,in_stack_ffffffffffffffb8);
  return extraout_EAX;
}

Assistant:

void bind(const endpoint_type& endpoint)
  {
    asio::error_code ec;
    impl_.get_service().bind(impl_.get_implementation(), endpoint, ec);
    asio::detail::throw_error(ec, "bind");
  }